

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

RuleBasedNumberFormat * __thiscall
icu_63::RuleBasedNumberFormat::operator=(RuleBasedNumberFormat *this,RuleBasedNumberFormat *rhs)

{
  uint uVar1;
  int iVar2;
  DecimalFormatSymbols *pDVar3;
  UnicodeString *ctx;
  undefined4 extraout_var;
  BreakIterator *local_f0;
  UnicodeString local_b0;
  UParseError perror;
  UErrorCode status;
  RuleBasedNumberFormat *rhs_local;
  RuleBasedNumberFormat *this_local;
  
  if (this != rhs) {
    unique0x100002ae = rhs;
    NumberFormat::operator=(&this->super_NumberFormat,&rhs->super_NumberFormat);
    perror.postContext[0xc] = L'\0';
    perror.postContext[0xd] = L'\0';
    dispose(this);
    Locale::operator=(&this->locale,&stack0xffffffffffffffe0->locale);
    this->lenient = stack0xffffffffffffffe0->lenient;
    pDVar3 = getDecimalFormatSymbols(stack0xffffffffffffffe0);
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x32])(this,pDVar3);
    ctx = &stack0xffffffffffffffe0->originalDescription;
    if (stack0xffffffffffffffe0->localizations != (LocalizationInfo *)0x0) {
      LocalizationInfo::ref(stack0xffffffffffffffe0->localizations);
    }
    init(this,(EVP_PKEY_CTX *)ctx);
    (*(stack0xffffffffffffffe0->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x30])
              ();
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x2f])
              (this,&local_b0,perror.postContext + 0xc);
    UnicodeString::~UnicodeString(&local_b0);
    uVar1 = (*(stack0xffffffffffffffe0->super_NumberFormat).super_Format.super_UObject._vptr_UObject
              [0x22])();
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x23])(this,(ulong)uVar1);
    this->capitalizationInfoSet = stack0xffffffffffffffe0->capitalizationInfoSet;
    this->capitalizationForUIListMenu = stack0xffffffffffffffe0->capitalizationForUIListMenu;
    this->capitalizationForStandAlone = stack0xffffffffffffffe0->capitalizationForStandAlone;
    if (stack0xffffffffffffffe0->capitalizationBrkIter == (BreakIterator *)0x0) {
      local_f0 = (BreakIterator *)0x0;
    }
    else {
      iVar2 = (*(stack0xffffffffffffffe0->capitalizationBrkIter->super_UObject)._vptr_UObject[4])();
      local_f0 = (BreakIterator *)CONCAT44(extraout_var,iVar2);
    }
    this->capitalizationBrkIter = local_f0;
  }
  return this;
}

Assistant:

RuleBasedNumberFormat&
RuleBasedNumberFormat::operator=(const RuleBasedNumberFormat& rhs)
{
    if (this == &rhs) {
        return *this;
    }
    NumberFormat::operator=(rhs);
    UErrorCode status = U_ZERO_ERROR;
    dispose();
    locale = rhs.locale;
    lenient = rhs.lenient;

    UParseError perror;
    setDecimalFormatSymbols(*rhs.getDecimalFormatSymbols());
    init(rhs.originalDescription, rhs.localizations ? rhs.localizations->ref() : NULL, perror, status);
    setDefaultRuleSet(rhs.getDefaultRuleSetName(), status);
    setRoundingMode(rhs.getRoundingMode());

    capitalizationInfoSet = rhs.capitalizationInfoSet;
    capitalizationForUIListMenu = rhs.capitalizationForUIListMenu;
    capitalizationForStandAlone = rhs.capitalizationForStandAlone;
#if !UCONFIG_NO_BREAK_ITERATION
    capitalizationBrkIter = (rhs.capitalizationBrkIter!=NULL)? rhs.capitalizationBrkIter->clone(): NULL;
#endif

    return *this;
}